

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::headerDataChanged
          (QAbstractItemModelTesterPrivate *this,Orientation orientation,int start,int end)

{
  uint uVar1;
  QAbstractItemModel *pQVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QAbstractItemModelTesterPrivate *in_RDI;
  long in_FS_OFFSET;
  int itemCount;
  int local_5c;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(-1 < in_EDX),(uchar *)"start >= 0",0x1b6819,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3f2);
  if ((((uVar1 & 1) != 0) &&
      (uVar1 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(-1 < in_ECX),(uchar *)"end >= 0",0x1b6819,
                      (uchar *)
                      "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                      ,0x3f3), (uVar1 & 1) != 0)) &&
     (uVar1 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(in_EDX <= in_ECX),(uchar *)"start <= end",
                     0x1b6819,(uchar *)
                              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3f4), (uVar1 & 1) != 0)) {
    if (in_ESI == 2) {
      pQVar2 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x193187);
      QModelIndex::QModelIndex((QModelIndex *)0x193196);
      local_5c = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,local_20);
    }
    else {
      pQVar2 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1931ba);
      QModelIndex::QModelIndex((QModelIndex *)0x1931c9);
      local_5c = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,local_38);
    }
    uVar1 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(in_EDX < local_5c),(uchar *)"start < itemCount",
                   0x1b6819,(uchar *)
                            "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3f6);
    if ((uVar1 & 1) != 0) {
      verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(in_ECX < local_5c),(uchar *)"end < itemCount",0x1b6819,
             (uchar *)
             "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
             ,0x3f7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::headerDataChanged(Qt::Orientation orientation, int start, int end)
{
    MODELTESTER_VERIFY(start >= 0);
    MODELTESTER_VERIFY(end >= 0);
    MODELTESTER_VERIFY(start <= end);
    int itemCount = orientation == Qt::Vertical ? model->rowCount() : model->columnCount();
    MODELTESTER_VERIFY(start < itemCount);
    MODELTESTER_VERIFY(end < itemCount);
}